

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_write_regions
                   (opj_j2k_t *p_j2k,opj_stream_private *p_stream,opj_event_mgr *p_manager)

{
  opj_tccp_t *poVar1;
  OPJ_BYTE *p_buffer;
  opj_tccp_t *poVar2;
  OPJ_SIZE_T OVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x15e6,
                  "OPJ_BOOL opj_j2k_write_regions(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  if (p_manager != (opj_event_mgr *)0x0) {
    if (p_stream == (opj_stream_private *)0x0) {
      __assert_fail("p_stream != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                    ,0x15e8,
                    "OPJ_BOOL opj_j2k_write_regions(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                   );
    }
    poVar1 = ((p_j2k->m_cp).tcps)->tccps;
    lVar7 = 0x328;
    uVar5 = 0;
    do {
      uVar4 = p_j2k->m_private_image->numcomps;
      if (uVar4 <= uVar5) {
        return 1;
      }
      if (*(int *)((long)poVar1->stepsizes + lVar7 + -0x1c) != 0) {
        p_buffer = (p_j2k->m_specific_param).m_encoder.m_header_tile_data;
        poVar2 = ((p_j2k->m_cp).tcps)->tccps;
        uVar6 = (uint)(uVar4 < 0x101);
        uVar4 = 2 - uVar6;
        opj_write_bytes_LE(p_buffer,0xff5e,2);
        opj_write_bytes_LE(p_buffer + 2,6 - uVar6,2);
        opj_write_bytes_LE(p_buffer + 4,(OPJ_UINT32)uVar5,uVar4);
        opj_write_bytes_LE(p_buffer + (ulong)uVar4 + 4,0,1);
        opj_write_bytes_LE(p_buffer + (ulong)uVar4 + 5,
                           *(OPJ_UINT32 *)((long)poVar2->stepsizes + lVar7 + -0x1c),1);
        OVar3 = opj_stream_write_data
                          (p_stream,(p_j2k->m_specific_param).m_encoder.m_header_tile_data,
                           (ulong)(8 - uVar6),p_manager);
        if (OVar3 != 8 - uVar6) {
          return 0;
        }
      }
      uVar5 = uVar5 + 1;
      lVar7 = lVar7 + 0x438;
    } while( true );
  }
  __assert_fail("p_manager != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0x15e7,
                "OPJ_BOOL opj_j2k_write_regions(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_write_regions(opj_j2k_t *p_j2k,
                                      struct opj_stream_private *p_stream,
                                      struct opj_event_mgr * p_manager)
{
    OPJ_UINT32 compno;
    const opj_tccp_t *l_tccp = 00;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_stream != 00);

    l_tccp = p_j2k->m_cp.tcps->tccps;

    for (compno = 0; compno < p_j2k->m_private_image->numcomps; ++compno)  {
        if (l_tccp->roishift) {

            if (! opj_j2k_write_rgn(p_j2k, 0, compno, p_j2k->m_private_image->numcomps,
                                    p_stream, p_manager)) {
                return OPJ_FALSE;
            }
        }

        ++l_tccp;
    }

    return OPJ_TRUE;
}